

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O2

void test_bson_iter_from_data(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  uint8_t data [9];
  bson_iter_t iter;
  undefined8 local_110;
  undefined1 local_108;
  undefined1 local_100 [248];
  
  local_110 = 0x100620800000009;
  local_108 = 0;
  cVar1 = bson_iter_init_from_data(local_100,&local_110,9);
  if (cVar1 == '\0') {
    pcVar4 = "bson_iter_init_from_data (&iter, data, sizeof data)";
    uVar3 = 0x25c;
  }
  else {
    cVar1 = bson_iter_next(local_100);
    if (cVar1 == '\0') {
      pcVar4 = "bson_iter_next (&iter)";
      uVar3 = 0x25d;
    }
    else {
      iVar2 = bson_iter_type(local_100);
      if (iVar2 == 8) {
        cVar1 = bson_iter_bool(local_100);
        if (cVar1 != '\0') {
          return;
        }
        pcVar4 = "bson_iter_bool (&iter)";
        uVar3 = 0x25f;
      }
      else {
        pcVar4 = "BSON_ITER_HOLDS_BOOL (&iter)";
        uVar3 = 0x25e;
      }
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
          uVar3,"test_bson_iter_from_data",pcVar4);
  abort();
}

Assistant:

static void
test_bson_iter_from_data (void)
{
   /* {"b": true}, with implicit NULL at end */
   uint8_t data[] = "\x09\x00\x00\x00\x08\x62\x00\x01";
   bson_iter_t iter;

   ASSERT (bson_iter_init_from_data (&iter, data, sizeof data));
   ASSERT (bson_iter_next (&iter));
   ASSERT (BSON_ITER_HOLDS_BOOL (&iter));
   ASSERT (bson_iter_bool (&iter));
}